

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O2

void MapOptHandler_PrecacheClasses(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  FName local_24;
  
  FMapInfoParser::ParseAssign(parse);
  do {
    FScanner::MustGetString(&parse->sc);
    FName::FName(&local_24,(parse->sc).String);
    TArray<FName,_FName>::Push(&info->PrecacheClasses,&local_24);
    bVar1 = FScanner::CheckString(&parse->sc,",");
  } while (bVar1);
  return;
}

Assistant:

DEFINE_MAP_OPTION(PrecacheClasses, true)
{
	parse.ParseAssign();

	do
	{
		parse.sc.MustGetString();
		//the class list is not initialized here so all we can do is store the class's name.
		info->PrecacheClasses.Push(parse.sc.String);
	} while (parse.sc.CheckString(","));
}